

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-util.c
# Opt level: O1

char * borg_trim(char *line)

{
  ushort *puVar1;
  byte *pbVar2;
  ushort **ppuVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *__s;
  
  ppuVar3 = __ctype_b_loc();
  puVar1 = *ppuVar3;
  __s = (byte *)(line + -1);
  do {
    pbVar5 = __s + 1;
    __s = __s + 1;
  } while ((*(byte *)((long)puVar1 + (ulong)*pbVar5 * 2 + 1) & 0x20) != 0);
  if (*pbVar5 != 0) {
    sVar4 = strlen((char *)__s);
    pbVar5 = __s + sVar4;
    do {
      pbVar2 = pbVar5;
      pbVar5 = pbVar2 + -1;
      if (pbVar5 <= __s) break;
    } while ((*(byte *)((long)puVar1 + (ulong)*pbVar5 * 2 + 1) & 0x20) != 0);
    *pbVar2 = 0;
  }
  return (char *)__s;
}

Assistant:

char *borg_trim(char *line)
{
    /* Trim leading space */
    while (isspace((unsigned char)*line))
        line++;

    /* All spaces */
    if (*line == 0)
        return line;

    /* Trim trailing spaces */
    char *end = line + strlen(line) - 1;
    while (end > line && isspace((unsigned char)*end))
        end--;

    /* Write new null terminator character */
    end[1] = '\0';

    return line;
}